

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalFullXPtr(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  xmlNodeSetPtr pxVar1;
  xmlXPathObjectPtr obj_00;
  bool bVar2;
  xmlNodeSetPtr loc;
  xmlXPathObjectPtr obj;
  xmlChar *name_local;
  xmlXPathParserContextPtr ctxt_local;
  
  obj = (xmlXPathObjectPtr)name;
  if (name == (xmlChar *)0x0) {
    obj = (xmlXPathObjectPtr)xmlXPathParseName(ctxt);
  }
  if (obj == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,7);
  }
  else {
    while (obj != (xmlXPathObjectPtr)0x0) {
      ctxt->error = 0;
      xmlXPtrEvalXPtrPart(ctxt,(xmlChar *)obj);
      if ((ctxt->error != 0) && (ctxt->error != 0x76c)) {
        return;
      }
      if (ctxt->value != (xmlXPathObjectPtr)0x0) {
        if (((ctxt->value->type == XPATH_NODESET) &&
            (pxVar1 = ctxt->value->nodesetval, pxVar1 != (xmlNodeSetPtr)0x0)) &&
           (0 < pxVar1->nodeNr)) {
          return;
        }
        while (obj_00 = valuePop(ctxt), obj_00 != (xmlXPathObjectPtr)0x0) {
          xmlXPathFreeObject(obj_00);
        }
      }
      while( true ) {
        bVar2 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
          bVar2 = *ctxt->cur == '\r';
        }
        if (!bVar2) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      obj = (xmlXPathObjectPtr)xmlXPathParseName(ctxt);
    }
  }
  return;
}

Assistant:

static void
xmlXPtrEvalFullXPtr(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    if (name == NULL)
    name = xmlXPathParseName(ctxt);
    if (name == NULL)
	XP_ERROR(XPATH_EXPR_ERROR);
    while (name != NULL) {
	ctxt->error = XPATH_EXPRESSION_OK;
	xmlXPtrEvalXPtrPart(ctxt, name);

	/* in case of syntax error, break here */
	if ((ctxt->error != XPATH_EXPRESSION_OK) &&
            (ctxt->error != XML_XPTR_UNKNOWN_SCHEME))
	    return;

	/*
	 * If the returned value is a non-empty nodeset
	 * or location set, return here.
	 */
	if (ctxt->value != NULL) {
	    xmlXPathObjectPtr obj = ctxt->value;

	    switch (obj->type) {
		case XPATH_NODESET: {
		    xmlNodeSetPtr loc = ctxt->value->nodesetval;
		    if ((loc != NULL) && (loc->nodeNr > 0))
			return;
		    break;
		}
		default:
		    break;
	    }

	    /*
	     * Evaluating to improper values is equivalent to
	     * a sub-resource error, clean-up the stack
	     */
	    do {
		obj = valuePop(ctxt);
		if (obj != NULL) {
		    xmlXPathFreeObject(obj);
		}
	    } while (obj != NULL);
	}

	/*
	 * Is there another XPointer part.
	 */
	SKIP_BLANKS;
	name = xmlXPathParseName(ctxt);
    }
}